

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  BFSEntry qe_00;
  FILE *__stream;
  bool bVar1;
  reference pvVar2;
  reference dep;
  undefined8 uVar3;
  pointer this_00;
  char *local_d0;
  undefined1 local_a0 [8];
  EntriesProcessing entriesProcessing;
  BFSEntry qe;
  cmComputeLinkDepends *this_local;
  
  AddDirectLinkEntries(this);
  while (bVar1 = std::
                 queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
                 ::empty(&this->BFSQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = std::
             queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
             ::front(&this->BFSQueue);
    qe_00.Index = pvVar2->Index;
    qe_00.GroupIndex = pvVar2->GroupIndex;
    qe_00.LibDepends = pvVar2->LibDepends;
    std::
    queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
    ::pop(&this->BFSQueue);
    FollowLinkEntry(this,qe_00);
  }
  while (bVar1 = std::
                 queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
                 ::empty(&this->SharedDepQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    dep = std::
          queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
          ::front(&this->SharedDepQueue);
    HandleSharedDependency(this,dep);
    std::
    queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
    ::pop(&this->SharedDepQueue);
  }
  InferDependencies(this);
  UpdateGroupDependencies(this);
  CleanConstraintGraph(this);
  if ((this->DebugMode & 1U) != 0) {
    fprintf(_stderr,
            "------------------------------------------------------------------------------\n");
    __stream = _stderr;
    cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    uVar3 = std::__cxx11::string::c_str();
    if ((this->HasConfig & 1U) == 0) {
      local_d0 = "noconfig";
    }
    else {
      local_d0 = (char *)std::__cxx11::string::c_str();
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",uVar3,local_d0);
    DisplayConstraintGraph(this);
  }
  std::make_unique<cmComputeComponentGraph,cmGraphAdjacencyList&>
            ((cmGraphAdjacencyList *)&entriesProcessing.Groups);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::operator=
            (&this->CCG,
             (unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
             &entriesProcessing.Groups);
  std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>::
  ~unique_ptr((unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_> *)
              &entriesProcessing.Groups);
  this_00 = std::unique_ptr<cmComputeComponentGraph,_std::default_delete<cmComputeComponentGraph>_>
            ::operator->(&this->CCG);
  cmComputeComponentGraph::Compute(this_00);
  bVar1 = CheckCircularDependencies(this);
  if (bVar1) {
    OrderLinkEntries(this);
    anon_unknown.dwarf_15e8ee4::EntriesProcessing::EntriesProcessing
              ((EntriesProcessing *)local_a0,this->Target,&this->LinkLanguage,&this->EntryList,
               &this->FinalLinkEntries);
    anon_unknown.dwarf_15e8ee4::EntriesProcessing::AddGroups
              ((EntriesProcessing *)local_a0,&this->GroupItems);
    anon_unknown.dwarf_15e8ee4::EntriesProcessing::AddLibraries
              ((EntriesProcessing *)local_a0,&this->FinalLinkOrder);
    anon_unknown.dwarf_15e8ee4::EntriesProcessing::AddObjects
              ((EntriesProcessing *)local_a0,&this->ObjectEntries);
    anon_unknown.dwarf_15e8ee4::EntriesProcessing::Finalize((EntriesProcessing *)local_a0);
    if ((this->DebugMode & 1U) != 0) {
      DisplayFinalEntries(this);
    }
    anon_unknown.dwarf_15e8ee4::EntriesProcessing::~EntriesProcessing((EntriesProcessing *)local_a0)
    ;
  }
  this_local = (cmComputeLinkDepends *)&this->FinalLinkEntries;
  return (vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          *)this_local;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while (!this->BFSQueue.empty()) {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
  }

  // Complete the search of shared library dependencies.
  while (!this->SharedDepQueue.empty()) {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
  }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // finalize groups dependencies
  // All dependencies which are raw items must be replaced by the group
  // it belongs to, if any.
  this->UpdateGroupDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if (this->DebugMode) {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig ? this->Config.c_str() : "noconfig");
    this->DisplayConstraintGraph();
  }

  // Compute the DAG of strongly connected components.  The algorithm
  // used by cmComputeComponentGraph should identify the components in
  // the same order in which the items were originally discovered in
  // the BFS.  This should preserve the original order when no
  // constraints disallow it.
  this->CCG =
    cm::make_unique<cmComputeComponentGraph>(this->EntryConstraintGraph);
  this->CCG->Compute();

  if (!this->CheckCircularDependencies()) {
    return this->FinalLinkEntries;
  }

  // Compute the final ordering.
  this->OrderLinkEntries();

  // Compute the final set of link entries.
  EntriesProcessing entriesProcessing{ this->Target, this->LinkLanguage,
                                       this->EntryList,
                                       this->FinalLinkEntries };
  // Add groups first, to ensure that libraries of the groups are always kept.
  entriesProcessing.AddGroups(this->GroupItems);
  entriesProcessing.AddLibraries(this->FinalLinkOrder);
  entriesProcessing.AddObjects(this->ObjectEntries);
  entriesProcessing.Finalize();

  // Display the final set.
  if (this->DebugMode) {
    this->DisplayFinalEntries();
  }

  return this->FinalLinkEntries;
}